

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BifFileReader.cpp
# Opt level: O0

void __thiscall BifFileReader<NWN::ResRef16>::~BifFileReader(BifFileReader<NWN::ResRef16> *this)

{
  FileWrapper *in_RDI;
  vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
  *unaff_retaddr;
  
  in_RDI->m_File = (HANDLE)&PTR_OpenFile_00299120;
  if (in_RDI->m_View != (uchar *)0x0) {
    fclose((FILE *)in_RDI->m_View);
    in_RDI->m_View = (uchar *)0x0;
  }
  std::
  vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)&in_RDI[1].m_ExternalView);
  FileWrapper::~FileWrapper(in_RDI);
  return;
}

Assistant:

BifFileReader< ResRefT >::~BifFileReader(
	)
/*++

Routine Description:

	This routine cleans up an already-existing BifFileReader object.

Arguments:

	None.

Return Value:

	None.

Environment:

	User mode.

--*/
{
	if (m_File != nullptr)
	{

#if defined(_WINDOWS)
		CloseHandle( m_File );
#else
		fclose(m_File);
#endif
		m_File = nullptr;
	}
}